

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O1

void retry_control_destroy_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "Failed to destroy option (either name (%p) or value (%p) are NULL)";
    iVar1 = 0x50;
  }
  else {
    iVar1 = strcmp("initial_wait_time_in_secs",name);
    if ((iVar1 == 0) || (iVar1 = strcmp("max_jitter_percent",name), iVar1 == 0)) {
      free(value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "Failed to destroy option (option with name \'%s\' is not suppported)";
    iVar1 = 0x59;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
            ,"retry_control_destroy_option",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void retry_control_destroy_option(const char* name, const void* value)
{
    if ((name == NULL) || (value == NULL))
    {
        LogError("Failed to destroy option (either name (%p) or value (%p) are NULL)", name, value);
    }
    else if (strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, name) == 0 ||
        strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, name) == 0)
    {
        free((void*)value);
    }
    else
    {
        LogError("Failed to destroy option (option with name '%s' is not suppported)", name);
    }
}